

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void * __thiscall AllocatorState::alloc(AllocatorState *this,size_t size)

{
  long lVar1;
  size_t align;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *local_30;
  void *result;
  
  lVar1 = random();
  if (this->memalign_fraction_ * 100.0 <= (double)(int)(lVar1 % 100)) {
LAB_0011436a:
    local_30 = malloc(size);
    (*noopt_helper)(&local_30);
  }
  else {
    auVar4._8_4_ = (int)(size >> 0x20);
    auVar4._0_8_ = size;
    auVar4._12_4_ = 0x45300000;
    iVar2 = 5;
    do {
      do {
        bVar3 = iVar2 == 0;
        iVar2 = iVar2 + -1;
        if (bVar3) goto LAB_0011436a;
        lVar1 = random();
      } while ((ulong)(lVar1 % 0x12) < 3);
      align = 1L << ((byte)(lVar1 % 0x12) & 0x3f);
      auVar5._8_4_ = (int)(align >> 0x20);
      auVar5._0_8_ = align;
      auVar5._12_4_ = 0x45300000;
    } while ((7 < size) &&
            (((auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) * 6.0 <=
             (auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)align) - 4503599627370496.0)));
    local_30 = (void *)0x1234;
    iVar2 = PosixMemalign(&local_30,align,size);
    if ((iVar2 != 0) && (iVar2 != 0xc)) {
      fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
              ,0x184,"err","==","12");
      abort();
    }
    if (iVar2 != 0) {
      local_30 = (void *)0x0;
    }
  }
  return local_30;
}

Assistant:

void* alloc(size_t size) {
    if (Uniform(100) < memalign_fraction_ * 100) {
      // Try a few times to find a reasonable alignment, or fall back on malloc.
      for (int i = 0; i < 5; i++) {
        size_t alignment = size_t{1} << Uniform(FLAGS_lg_max_memalign);
        if (alignment >= sizeof(intptr_t) &&
            (size < sizeof(intptr_t) ||
             alignment < FLAGS_memalign_max_alignment_ratio * size)) {
          void *result = reinterpret_cast<void*>(static_cast<intptr_t>(0x1234));
          int err = PosixMemalign(&result, alignment, size);
          if (err != 0) {
            CHECK_EQ(err, ENOMEM);
          }
          return err == 0 ? result : nullptr;
        }
      }
    }
    return noopt(malloc(size));
  }